

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpkne(fitsfile *fptr,char *keyroot,int nstart,int nkey,float *value,int decim,char **comm,
          int *status)

{
  bool bVar1;
  size_t sVar2;
  int in_ECX;
  fitsfile *in_R8;
  undefined4 in_R9D;
  bool bVar3;
  long *in_stack_00000008;
  int len;
  int repeat;
  int jj;
  int ii;
  char tcomment [73];
  char keyname [75];
  int local_e0;
  int local_d8;
  int local_cc;
  char local_c8 [8];
  int *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  if (*_len < 1) {
    bVar1 = false;
    if (in_stack_00000008 == (long *)0x0) {
      bVar1 = true;
      local_c8[0] = '\0';
    }
    else {
      sVar2 = strlen((char *)*in_stack_00000008);
      local_d8 = (int)sVar2;
      while( true ) {
        bVar3 = false;
        if (0 < local_d8) {
          bVar3 = *(char *)(*in_stack_00000008 + (long)(local_d8 + -1)) == ' ';
        }
        if (!bVar3) break;
        local_d8 = local_d8 + -1;
      }
      if ((0 < local_d8) && (*(char *)(*in_stack_00000008 + (long)(local_d8 + -1)) == '&')) {
        if (local_d8 < 0x49) {
          local_e0 = local_d8;
        }
        else {
          local_e0 = 0x49;
        }
        local_c8[0] = '\0';
        strncat(local_c8,(char *)*in_stack_00000008,(long)(local_e0 + -1));
        bVar1 = true;
      }
    }
    for (local_cc = 0; local_cc < in_ECX; local_cc = local_cc + 1) {
      ffkeyn(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
      if (bVar1) {
        ffpkye(in_R8,(char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        ffpkye(in_R8,(char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      if (0 < *_len) {
        return *_len;
      }
    }
    local_4 = *_len;
  }
  else {
    local_4 = *_len;
  }
  return local_4;
}

Assistant:

int ffpkne( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyroot,      /* I - root name of keywords to write       */
            int  nstart,        /* I - starting index number                */
            int  nkey,          /* I - number of keywords to write          */
            float *value,       /* I - array of keyword values              */
            int decim,          /* I - number of decimals to display        */
            char *comm[],       /* I - array of pointers to keyword comment */
            int  *status)       /* IO - error status                        */
/*
  Write (put) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NKEY -1) inclusive.  Writes exponential float values.
*/
{
    char keyname[FLEN_KEYWORD], tcomment[FLEN_COMMENT];
    int ii, jj, repeat, len;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check if first comment string is to be repeated for all the keywords */
    /* by looking to see if the last non-blank character is a '&' char      */

    repeat = 0;

    if (comm)
    {
      len = strlen(comm[0]);

      while (len > 0  && comm[0][len - 1] == ' ')
        len--;                               /* ignore trailing blanks */

      if (len > 0 && comm[0][len - 1] == '&')
      {
        len = minvalue(len, FLEN_COMMENT);
        tcomment[0] = '\0';
        strncat(tcomment, comm[0], len-1); /* don't copy the final '&' char */
        repeat = 1;
      }
    }
    else
    {
      repeat = 1;
      tcomment[0] = '\0';
    }

    for (ii=0, jj=nstart; ii < nkey; ii++, jj++)
    {
        ffkeyn(keyroot, jj, keyname, status);
        if (repeat)
            ffpkye(fptr, keyname, value[ii], decim, tcomment, status);
        else
            ffpkye(fptr, keyname, value[ii], decim, comm[ii], status);

        if (*status > 0)
            return(*status);
    }
    return(*status);
}